

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sb_multipass_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_b0c20c::AV1SBMultipassTest::~AV1SBMultipassTest(AV1SBMultipassTest *this)

{
  pointer puVar1;
  pointer pcVar2;
  
  (this->super_CodecTestWith2Params<int,_bool>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_int,_bool>_>.super_Test.
  _vptr_Test = (_func_int **)&PTR__AV1SBMultipassTest_010555c0;
  (this->super_CodecTestWith2Params<int,_bool>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_int,_bool>_>.
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_int,_bool>_>.
  _vptr_WithParamInterface = (_func_int **)&PTR__AV1SBMultipassTest_01055618;
  (this->super_EncoderTest)._vptr_EncoderTest = (_func_int **)&PTR__AV1SBMultipassTest_01055638;
  if (this->decoder_ != (Decoder *)0x0) {
    (*this->decoder_->_vptr_Decoder[1])();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->md5_dec_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->md5_enc_);
  puVar1 = (this->size_enc_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  (this->super_EncoderTest)._vptr_EncoderTest = (_func_int **)&PTR__EncoderTest_01081d70;
  pcVar2 = (this->super_EncoderTest).stats_.buffer_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->super_EncoderTest).stats_.buffer_.field_2) {
    operator_delete(pcVar2);
  }
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  return;
}

Assistant:

~AV1SBMultipassTest() override { delete decoder_; }